

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

bool __thiscall
QSocks5SocketEngine::initialize
          (QSocks5SocketEngine *this,qintptr socketDescriptor,SocketState socketState)

{
  NetworkLayerProtocol NVar1;
  QSocks5SocketEnginePrivate *this_00;
  QSocks5BindData *pQVar2;
  QSocks5ConnectData *this_01;
  long lVar3;
  int in_EDX;
  char *in_RDI;
  long in_FS_OFFSET;
  QSocks5BindData *bindData;
  QSocks5SocketEnginePrivate *d;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socks5BindStore>_>
  *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  bool local_41;
  Connection local_40;
  Connection local_38;
  Connection local_30;
  Connection local_28;
  Connection local_20;
  Connection local_18 [2];
  qintptr socketDescriptor_00;
  
  socketDescriptor_00 = *(qintptr *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSocks5SocketEngine *)0x3720b9);
  if (in_EDX == 3) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socks5BindStore>_>::operator()
              (in_stack_ffffffffffffff68);
    pQVar2 = QSocks5BindStore::retrieve((QSocks5BindStore *)this_00,socketDescriptor_00);
    if (pQVar2 == (QSocks5BindData *)0x0) {
      local_41 = false;
    }
    else {
      (this_00->super_QAbstractSocketEnginePrivate).socketState = ConnectedState;
      (this_00->super_QAbstractSocketEnginePrivate).socketType = TcpSocket;
      this_01 = (QSocks5ConnectData *)operator_new(0x38);
      QSocks5ConnectData::QSocks5ConnectData((QSocks5ConnectData *)0x37212e);
      this_00->connectData = this_01;
      this_00->data = &this_00->connectData->super_QSocks5Data;
      this_00->mode = ConnectMode;
      this_00->data->controlSocket = (pQVar2->super_QSocks5Data).controlSocket;
      (pQVar2->super_QSocks5Data).controlSocket = (QTcpSocket *)0x0;
      QObject::setParent((QObject *)this_00->data->controlSocket);
      QAbstractSocket::localAddress((QAbstractSocket *)this_01);
      NVar1 = QHostAddress::protocol((QHostAddress *)0x3721cb);
      (this_00->super_QAbstractSocketEnginePrivate).socketProtocol = NVar1;
      QHostAddress::~QHostAddress((QHostAddress *)0x3721e5);
      this_00->data->authenticator = (pQVar2->super_QSocks5Data).authenticator;
      (pQVar2->super_QSocks5Data).authenticator = (QSocks5Authenticator *)0x0;
      (this_00->super_QAbstractSocketEnginePrivate).localPort = pQVar2->localPort;
      QHostAddress::operator=
                ((QHostAddress *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 (QHostAddress *)in_stack_ffffffffffffff68);
      (this_00->super_QAbstractSocketEnginePrivate).peerPort = pQVar2->peerPort;
      QHostAddress::operator=
                ((QHostAddress *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 (QHostAddress *)in_stack_ffffffffffffff68);
      (this_00->super_QAbstractSocketEnginePrivate).outboundStreamCount = 1;
      (this_00->super_QAbstractSocketEnginePrivate).inboundStreamCount = 1;
      if (pQVar2 != (QSocks5BindData *)0x0) {
        QSocks5BindData::~QSocks5BindData
                  ((QSocks5BindData *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70))
        ;
        operator_delete(pQVar2,0x40);
      }
      QObject::connect((QObject *)local_18,(char *)this_00->data->controlSocket,
                       (QObject *)"2connected()",in_RDI,0x3e9314);
      QMetaObject::Connection::~Connection(local_18);
      QObject::connect((QObject *)&local_20,(char *)this_00->data->controlSocket,
                       (QObject *)"2readyRead()",in_RDI,0x3e9331);
      QMetaObject::Connection::~Connection(&local_20);
      QObject::connect((QObject *)&local_28,(char *)this_00->data->controlSocket,
                       (QObject *)"2bytesWritten(qint64)",in_RDI,0x3e9355);
      QMetaObject::Connection::~Connection(&local_28);
      QObject::connect((QObject *)&local_30,(char *)this_00->data->controlSocket,
                       (QObject *)"2errorOccurred(QAbstractSocket::SocketError)",in_RDI,0x3e9375);
      QMetaObject::Connection::~Connection(&local_30);
      QObject::connect((QObject *)&local_38,(char *)this_00->data->controlSocket,
                       (QObject *)"2disconnected()",in_RDI,0x3e93b2);
      QMetaObject::Connection::~Connection(&local_38);
      QObject::connect((QObject *)&local_40,(char *)this_00->data->controlSocket,
                       (QObject *)"2stateChanged(QAbstractSocket::SocketState)",in_RDI,0x3e93d2);
      QMetaObject::Connection::~Connection(&local_40);
      this_00->socks5State = Connected;
      lVar3 = (**(code **)(*(long *)&this_00->data->controlSocket->super_QAbstractSocket + 0xa0))();
      if (lVar3 != 0) {
        QSocks5SocketEnginePrivate::_q_controlSocketReadNotification
                  ((QSocks5SocketEnginePrivate *)
                   CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      }
      local_41 = true;
    }
  }
  else {
    local_41 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == socketDescriptor_00) {
    return local_41;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::initialize(qintptr socketDescriptor, QAbstractSocket::SocketState socketState)
{
    Q_D(QSocks5SocketEngine);

    QSOCKS5_Q_DEBUG << "initialize" << socketDescriptor;

    // this is only valid for the other side of a bind, nothing else is supported

    if (socketState != QAbstractSocket::ConnectedState) {
        //### must be connected state ???
        return false;
    }

    QSocks5BindData *bindData = socks5BindStore()->retrieve(socketDescriptor);
    if (bindData) {

        d->socketState = QAbstractSocket::ConnectedState;
        d->socketType = QAbstractSocket::TcpSocket;
        d->connectData = new QSocks5ConnectData;
        d->data = d->connectData;
        d->mode = QSocks5SocketEnginePrivate::ConnectMode;
        d->data->controlSocket = bindData->controlSocket;
        bindData->controlSocket = nullptr;
        d->data->controlSocket->setParent(this);
        d->socketProtocol = d->data->controlSocket->localAddress().protocol();
        d->data->authenticator = bindData->authenticator;
        bindData->authenticator = nullptr;
        d->localPort = bindData->localPort;
        d->localAddress = bindData->localAddress;
        d->peerPort = bindData->peerPort;
        d->peerAddress = bindData->peerAddress;
        d->inboundStreamCount = d->outboundStreamCount = 1;
        delete bindData;

        QObject::connect(d->data->controlSocket, SIGNAL(connected()), this, SLOT(_q_controlSocketConnected()),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(readyRead()), this, SLOT(_q_controlSocketReadNotification()),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(bytesWritten(qint64)), this, SLOT(_q_controlSocketBytesWritten()),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(errorOccurred(QAbstractSocket::SocketError)), this, SLOT(_q_controlSocketErrorOccurred(QAbstractSocket::SocketError)),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(disconnected()), this, SLOT(_q_controlSocketDisconnected()),
                         Qt::DirectConnection);
        QObject::connect(d->data->controlSocket, SIGNAL(stateChanged(QAbstractSocket::SocketState)),
                         this, SLOT(_q_controlSocketStateChanged(QAbstractSocket::SocketState)),
                         Qt::DirectConnection);

        d->socks5State = QSocks5SocketEnginePrivate::Connected;

        if (d->data->controlSocket->bytesAvailable() != 0)
            d->_q_controlSocketReadNotification();
        return true;
    }
    return false;
}